

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateImportFileConfig
          (cmExportInstallFileGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  bool bVar4;
  string fileName;
  string local_420;
  string se;
  cmGeneratedFileStream exportFileStream;
  ostringstream e;
  
  bVar1 = cmInstallGenerator::InstallsForConfig(&this->IEGen->super_cmInstallGenerator,config);
  bVar4 = true;
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&fileName,(string *)&(this->super_cmExportFileGenerator).FileDir);
    std::__cxx11::string::append((char *)&fileName);
    std::__cxx11::string::append((string *)&fileName);
    std::__cxx11::string::append((char *)&fileName);
    if (config->_M_string_length == 0) {
      std::__cxx11::string::append((char *)&fileName);
    }
    else {
      cmsys::SystemTools::LowerCase((string *)&exportFileStream,config);
      std::__cxx11::string::append((string *)&fileName);
      std::__cxx11::string::~string((string *)&exportFileStream);
    }
    std::__cxx11::string::append((string *)&fileName);
    cmGeneratedFileStream::cmGeneratedFileStream(&exportFileStream,&fileName,true,None);
    bVar4 = ((&exportFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               field_0x20)
             [(long)exportFileStream.super_ofstream.
                    super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
            == 0;
    if (bVar4) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[4])
                (this,&exportFileStream,config);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,(ostream *)&exportFileStream,config,
                 missingTargets);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[5])(this,&exportFileStream);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigImportFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar3);
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar2 = std::operator<<((ostream *)&e,"cannot write to file \"");
      poVar2 = std::operator<<(poVar2,(string *)&fileName);
      poVar2 = std::operator<<(poVar2,"\": ");
      std::operator<<(poVar2,(string *)&se);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&se);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&exportFileStream);
    std::__cxx11::string::~string((string *)&fileName);
  }
  return bVar4;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateImportFileConfig(
  const std::string& config, std::vector<std::string>& missingTargets)
{
  // Skip configurations not enabled for this export.
  if (!this->IEGen->InstallsForConfig(config)) {
    return true;
  }

  // Construct the name of the file to generate.
  std::string fileName = this->FileDir;
  fileName += "/";
  fileName += this->FileBase;
  fileName += "-";
  if (!config.empty()) {
    fileName += cmSystemTools::LowerCase(config);
  } else {
    fileName += "noconfig";
  }
  fileName += this->FileExt;

  // Open the output file to generate it.
  cmGeneratedFileStream exportFileStream(fileName, true);
  if (!exportFileStream) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  std::ostream& os = exportFileStream;

  // Start with the import file header.
  this->GenerateImportHeaderCode(os, config);

  // Generate the per-config target information.
  this->GenerateImportConfig(os, config, missingTargets);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);

  // Record this per-config import file.
  this->ConfigImportFiles[config] = fileName;

  return true;
}